

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crab-combat.cpp
# Opt level: O0

size_t score(decks_t *result,size_t p1,size_t p2)

{
  bool bVar1;
  mapped_type *pmVar2;
  unsigned_long uVar3;
  cards_t *local_90;
  const_reverse_iterator local_78;
  const_reverse_iterator local_58;
  undefined4 local_34;
  cards_t *pcStack_30;
  int i;
  cards_t *winner_deck;
  size_t winner;
  size_t p2_local;
  size_t p1_local;
  decks_t *result_local;
  
  winner = p2;
  p2_local = p1;
  p1_local = (size_t)result;
  pmVar2 = std::
           unordered_map<unsigned_long,_deck_t,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>_>
           ::at(result,&p2_local);
  bVar1 = std::deque<unsigned_long,_std::allocator<unsigned_long>_>::empty(&pmVar2->cards);
  if (bVar1) {
    local_90 = (cards_t *)winner;
  }
  else {
    local_90 = (cards_t *)p2_local;
  }
  winner_deck = local_90;
  pmVar2 = std::
           unordered_map<unsigned_long,_deck_t,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_deck_t>_>_>
           ::at(result,(key_type *)&winner_deck);
  pcStack_30 = &pmVar2->cards;
  local_34 = 1;
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::crbegin(&local_58,pcStack_30);
  std::deque<unsigned_long,_std::allocator<unsigned_long>_>::crend(&local_78,pcStack_30);
  uVar3 = std::
          accumulate<std::reverse_iterator<std::_Deque_iterator<unsigned_long,unsigned_long_const&,unsigned_long_const*>>,unsigned_long,score(std::unordered_map<unsigned_long,deck_t,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,deck_t>>>,unsigned_long,unsigned_long)::__0>
                    (&local_58,&local_78,0,(anon_class_8_1_54a39809)&local_34);
  return uVar3;
}

Assistant:

size_t score(decks_t result, size_t p1, size_t p2) {
  auto winner = result.at(p1).cards.empty() ? p2 : p1;
  const auto& winner_deck = result.at(winner).cards;

  auto i = 1;
  return std::accumulate(winner_deck.crbegin(), winner_deck.crend(), uint64_t{0}, [&i](auto a, auto v){
    return a + v * (i++);
  });
}